

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O2

void __thiscall
adios2::transport::FileStdio::OpenChain
          (FileStdio *this,string *name,Mode openMode,Comm *chainComm,bool async,bool directio)

{
  Comm *pCVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  _Result<_IO_FILE_*> *p_Var5;
  int *piVar6;
  FILE *pFVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *__modes;
  pointer __filename;
  undefined7 in_register_00000081;
  _State_baseV2 *__tmp;
  __allocator_type __a2;
  allocator local_109;
  string local_108;
  FileStdio *local_e8;
  int token;
  string local_d8;
  Comm *local_b8;
  thread local_b0;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  Comm local_78;
  __allocator_type __a2_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  token = 1;
  __rhs = &(this->super_Transport).m_Name;
  std::__cxx11::string::_M_assign((string *)__rhs);
  (*(this->super_Transport)._vptr_Transport[0x13])(this);
  iVar2 = helper::Comm::Rank(chainComm);
  pCVar1 = (Comm *)CONCAT71(in_register_00000081,async);
  if (0 < iVar2) {
    local_b8 = (Comm *)CONCAT44(local_b8._4_4_,(int)(Comm *)CONCAT71(in_register_00000081,async));
    local_e8 = this;
    iVar2 = helper::Comm::Rank(chainComm);
    std::__cxx11::string::string
              ((string *)&local_108,"Chain token in FileStdio::OpenChain",(allocator *)&local_a8);
    helper::Comm::Recv<int>((Status *)&local_d8,chainComm,&token,1,iVar2 + -1,0,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    this = local_e8;
    pCVar1 = local_b8;
  }
  (this->super_Transport).m_OpenMode = openMode;
  if (openMode == Append) {
    piVar6 = __errno_location();
    *piVar6 = 0;
    pFVar7 = fopen((name->_M_dataplus)._M_p,"rwb");
    this->m_File = (FILE *)pFVar7;
    fseek(pFVar7,0,2);
    goto LAB_005f7f20;
  }
  if (openMode == Read) {
    piVar6 = __errno_location();
    *piVar6 = 0;
    __filename = (name->_M_dataplus)._M_p;
    __modes = "rb";
  }
  else {
    if (openMode != Write) {
      std::__cxx11::string::string((string *)&local_108,"Toolkit",(allocator *)&local_b0);
      std::__cxx11::string::string
                ((string *)&local_d8,"transport::file::FileStdio",(allocator *)&__a2);
      std::__cxx11::string::string((string *)&local_a8,"Open",&local_109);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__a2_1,
                     "unknown open mode for file ",__rhs);
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (&local_108,&local_d8,&local_a8,(string *)&__a2_1,-1);
      std::__cxx11::string::~string((string *)&__a2_1);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_108);
      goto LAB_005f7f20;
    }
    if ((char)pCVar1 != '\0') {
      this->m_IsOpening = true;
      local_d8._M_dataplus._M_p = (pointer)0x0;
      local_d8._M_string_length = 0;
      local_b8 = chainComm;
      puVar4 = (undefined8 *)operator_new(0x68);
      puVar4[1] = 0x100000001;
      *puVar4 = &PTR___Sp_counted_ptr_inplace_008234e0;
      puVar4[3] = 0;
      *(undefined4 *)(puVar4 + 4) = 0;
      *(undefined1 *)((long)puVar4 + 0x24) = 0;
      *(undefined4 *)(puVar4 + 5) = 0;
      local_108._M_dataplus._M_p = (pointer)&__a2;
      puVar4[6] = 0;
      *(undefined4 *)(puVar4 + 7) = 0;
      local_e8 = (FileStdio *)(puVar4 + 2);
      puVar4[2] = &PTR___Async_state_impl_00823530;
      local_108._M_string_length = (size_type)puVar4;
      p_Var5 = (_Result<_IO_FILE_*> *)operator_new(0x20);
      std::__future_base::_Result<_IO_FILE_*>::_Result(p_Var5);
      puVar4[8] = p_Var5;
      std::__cxx11::string::string((string *)(puVar4 + 9),(string *)name);
      local_b0._M_id._M_thread = (id)0;
      ___a2_1 = (pointer)operator_new(0x20);
      *(undefined ***)___a2_1 = &PTR___State_00823588;
      *(FileStdio **)((long)___a2_1 + 8) = local_e8;
      *(code **)((long)___a2_1 + 0x10) =
           std::__future_base::
           _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FileStdio.cpp:109:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,__IO_FILE_*>
           ::_M_run;
      *(long *)((long)___a2_1 + 0x18) = 0;
      std::thread::_M_start_thread(&local_b0,&__a2_1,0);
      local_80 = __rhs;
      if ((long *)___a2_1 != (long *)0x0) {
        (**(code **)(*(long *)___a2_1 + 8))();
      }
      std::thread::operator=((thread *)(puVar4 + 6),&local_b0);
      std::thread::~thread(&local_b0);
      local_108._M_string_length = 0;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FileStdio.cpp:109:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,__IO_FILE_*>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FileStdio.cpp:109:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,__IO_FILE_*>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_transport_file_FileStdio_cpp:109:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,__IO_FILE_*>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_transport_file_FileStdio_cpp:109:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,__IO_FILE_*>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                          *)&local_108);
      local_108._M_dataplus._M_p = local_d8._M_dataplus._M_p;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      local_d8._M_dataplus._M_p = (pointer)local_e8;
      local_108._M_string_length = local_d8._M_string_length;
      local_d8._M_string_length = (size_type)puVar4;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_108._M_string_length);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length);
      if ((FileStdio *)local_d8._M_dataplus._M_p == (FileStdio *)0x0) {
        puVar4 = (undefined8 *)operator_new(0x58);
        puVar4[1] = 0x100000001;
        *puVar4 = &PTR___Sp_counted_ptr_inplace_008235c8;
        puVar4[3] = 0;
        local_108._M_dataplus._M_p = (pointer)&__a2_1;
        *(undefined4 *)(puVar4 + 4) = 0;
        *(undefined1 *)((long)puVar4 + 0x24) = 0;
        *(undefined4 *)(puVar4 + 5) = 0;
        puVar4[2] = &PTR___Deferred_state_00823618;
        local_108._M_string_length = (size_type)puVar4;
        p_Var5 = (_Result<_IO_FILE_*> *)operator_new(0x20);
        std::__future_base::_Result<_IO_FILE_*>::_Result(p_Var5);
        puVar4[6] = p_Var5;
        std::__cxx11::string::string((string *)(puVar4 + 7),(string *)name);
        local_108._M_string_length = 0;
        std::
        __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FileStdio.cpp:109:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,__IO_FILE_*>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FileStdio.cpp:109:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,__IO_FILE_*>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
        ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_transport_file_FileStdio_cpp:109:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,__IO_FILE_*>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_transport_file_FileStdio_cpp:109:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,__IO_FILE_*>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                            *)&local_108);
        local_a8._M_dataplus._M_p = (pointer)0x0;
        local_a8._M_string_length = 0;
        local_108._M_dataplus._M_p = local_d8._M_dataplus._M_p;
        local_108._M_string_length = local_d8._M_string_length;
        local_d8._M_dataplus._M_p = (pointer)(puVar4 + 2);
        local_d8._M_string_length = (size_type)puVar4;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_108._M_string_length);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length);
      }
      std::__basic_future<_IO_FILE_*>::__basic_future
                ((__basic_future<_IO_FILE_*> *)&local_108,(__state_type *)&local_d8);
      __rhs = local_80;
      chainComm = local_b8;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d8._M_string_length);
      std::future<_IO_FILE_*>::operator=(&this->m_OpenFuture,(future<_IO_FILE_*> *)&local_108);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_108._M_string_length);
      goto LAB_005f7f20;
    }
    piVar6 = __errno_location();
    *piVar6 = 0;
    __filename = (name->_M_dataplus)._M_p;
    __modes = "wb";
  }
  pFVar7 = fopen(__filename,__modes);
  this->m_File = (FILE *)pFVar7;
LAB_005f7f20:
  if (this->m_IsOpening == false) {
    std::operator+(&local_108,"couldn\'t open file ",__rhs);
    std::operator+(&local_50,&local_108,
                   ", check permissions or path existence, in call to stdio open");
    CheckFile(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_108);
    (this->super_Transport).m_IsOpen = true;
  }
  iVar2 = helper::Comm::Rank(chainComm);
  iVar3 = helper::Comm::Size(chainComm);
  if (iVar2 < iVar3 + -1) {
    iVar2 = helper::Comm::Rank(chainComm);
    std::__cxx11::string::string
              ((string *)&local_108,"Sending Chain token in FileStdio::OpenChain",
               (allocator *)&local_d8);
    helper::Comm::Isend<int>(&local_78,(int *)chainComm,(size_t)&token,1,iVar2 + 1,(string *)0x0);
    helper::Comm::Req::~Req((Req *)&local_78);
    std::__cxx11::string::~string((string *)&local_108);
  }
  return;
}

Assistant:

void FileStdio::OpenChain(const std::string &name, Mode openMode, const helper::Comm &chainComm,
                          const bool async, const bool directio)
{
    auto lf_AsyncOpenWrite = [&](const std::string &name) -> FILE * {
        errno = 0;
        return std::fopen(name.c_str(), "wb");
    };

    int token = 1;
    m_Name = name;
    CheckName();

    if (chainComm.Rank() > 0)
    {
        chainComm.Recv(&token, 1, chainComm.Rank() - 1, 0, "Chain token in FileStdio::OpenChain");
    }

    m_OpenMode = openMode;
    switch (m_OpenMode)
    {
    case Mode::Write:
        if (async)
        {
            m_IsOpening = true;
            m_OpenFuture = std::async(std::launch::async, lf_AsyncOpenWrite, name);
        }
        else
        {
            errno = 0;
            m_File = std::fopen(name.c_str(), "wb");
        }
        break;
    case Mode::Append:
        errno = 0;
        m_File = std::fopen(name.c_str(), "rwb");
        std::fseek(m_File, 0, SEEK_END);
        break;
    case Mode::Read:
        errno = 0;
        m_File = std::fopen(name.c_str(), "rb");
        break;
    default:
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "Open",
                                              "unknown open mode for file " + m_Name);
    }

    if (!m_IsOpening)
    {
        CheckFile("couldn't open file " + m_Name +
                  ", check permissions or path existence, in call to stdio open");
        m_IsOpen = true;
    }

    if (chainComm.Rank() < chainComm.Size() - 1)
    {
        chainComm.Isend(&token, 1, chainComm.Rank() + 1, 0,
                        "Sending Chain token in FileStdio::OpenChain");
    }
}